

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O0

void __thiscall cmCPackRPMGenerator::AddGeneratedPackageNames(cmCPackRPMGenerator *this)

{
  char *pcVar1;
  value_type local_b8;
  value_type local_98;
  long local_78;
  size_type pos2;
  size_type pos1;
  char sep;
  allocator local_51;
  string local_50;
  string local_30 [8];
  string fileNames;
  cmCPackRPMGenerator *this_local;
  
  fileNames.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"GEN_CPACK_OUTPUT_FILES",&local_51);
  pcVar1 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,(allocator *)((long)&pos1 + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&pos1 + 3));
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pos1._2_1_ = 0x3b;
  pos2 = 0;
  local_78 = std::__cxx11::string::find((char)local_30,0x3b);
  while (local_78 != -1) {
    std::__cxx11::string::substr((ulong)&local_98,(ulong)local_30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->super_cmCPackGenerator).packageFileNames,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    pos2 = local_78 + 1;
    local_78 = std::__cxx11::string::find((char)local_30,0x3b);
  }
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->super_cmCPackGenerator).packageFileNames,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void cmCPackRPMGenerator::AddGeneratedPackageNames()
{
  // add the generated packages to package file names list
  std::string fileNames(this->GetOption("GEN_CPACK_OUTPUT_FILES"));
  const char sep = ';';
  std::string::size_type pos1 = 0;
  std::string::size_type pos2 = fileNames.find(sep, pos1 + 1);
  while (pos2 != std::string::npos) {
    packageFileNames.push_back(fileNames.substr(pos1, pos2 - pos1));
    pos1 = pos2 + 1;
    pos2 = fileNames.find(sep, pos1 + 1);
  }
  packageFileNames.push_back(fileNames.substr(pos1, pos2 - pos1));
}